

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_concat.cpp
# Opt level: O0

ScalarFunction * duckdb::MapConcatFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  ScalarFunction *fun;
  LogicalType *other;
  LogicalType *this;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffee8;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  *in_stack_fffffffffffffef0;
  LogicalType local_d0 [24];
  LogicalType local_b8 [24];
  undefined1 local_a0 [32];
  LogicalType local_80 [24];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  allocator local_31;
  string local_30 [39];
  undefined1 local_9;
  
  local_9 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"map_concat",&local_31);
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0xd9cb75);
  duckdb::LogicalType::LogicalType(local_80,LIST);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  duckdb::LogicalType::LogicalType(local_b8,INVALID);
  this = (LogicalType *)0x0;
  other = (LogicalType *)0x0;
  duckdb::ScalarFunction::ScalarFunction
            (in_RDI,local_30,&local_68,local_80,local_a0,MapConcatBind,0,0,0,local_b8,0,0,0);
  duckdb::LogicalType::~LogicalType(local_b8);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xd9cc2e);
  duckdb::LogicalType::~LogicalType(local_80);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xd9cc48);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  in_RDI->field_0xa9 = 1;
  duckdb::LogicalType::LogicalType(local_d0,ANY);
  LogicalType::operator=(this,other);
  duckdb::LogicalType::~LogicalType(local_d0);
  return in_RDI;
}

Assistant:

ScalarFunction MapConcatFun::GetFunction() {
	//! the arguments and return types are actually set in the binder function
	ScalarFunction fun("map_concat", {}, LogicalTypeId::LIST, MapConcatFunction, MapConcatBind);
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	fun.varargs = LogicalType::ANY;
	return fun;
}